

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adiosCommMPI.cpp
# Opt level: O0

int __thiscall
adios2::helper::CommImplMPI::Win_shared_query
          (CommImplMPI *this,Win *win,int rank,size_t *size,int *disp_unit,void *baseptr,
          string *hint)

{
  int iVar1;
  long lVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__lhs;
  undefined8 *in_RCX;
  undefined4 in_EDX;
  Win *in_RSI;
  undefined8 in_R8;
  undefined8 in_R9;
  int ret;
  MPI_Aint asize;
  CommWinImplMPI *w;
  string *__rhs;
  string local_88 [24];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff90;
  char *in_stack_ffffffffffffff98;
  undefined8 local_40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_38;
  undefined8 local_30;
  undefined8 local_28;
  undefined8 *local_20;
  undefined4 local_14;
  
  local_30 = in_R9;
  local_28 = in_R8;
  local_20 = in_RCX;
  local_14 = in_EDX;
  lVar2 = adios2::helper::CommWinImpl::Get(in_RSI);
  if (lVar2 == 0) {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  }
  else {
    __lhs = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
            __dynamic_cast(lVar2,&CommWinImpl::typeinfo,&CommWinImplMPI::typeinfo,0);
  }
  local_38 = __lhs;
  iVar1 = MPI_Win_shared_query(__lhs->_M_string_length,local_14,&local_40,local_28,local_30);
  __rhs = local_88;
  std::operator+(in_stack_ffffffffffffff98,in_stack_ffffffffffffff90);
  std::operator+(__lhs,(char *)__rhs);
  anon_unknown_1::CheckMPIReturn(this._4_4_,(string *)win);
  std::__cxx11::string::~string((string *)&stack0xffffffffffffff98);
  std::__cxx11::string::~string(local_88);
  *local_20 = local_40;
  return iVar1;
}

Assistant:

int CommImplMPI::Win_shared_query(Comm::Win &win, int rank, size_t *size, int *disp_unit,
                                  void *baseptr, const std::string &hint) const
{
    CommWinImplMPI *w = dynamic_cast<CommWinImplMPI *>(CommWinImpl::Get(win));
    MPI_Aint asize;
    int ret = MPI_Win_shared_query(w->m_Win, rank, &asize, disp_unit, baseptr);
    CheckMPIReturn(ret, "in call to Win_shared_query " + hint + "\n");
    *size = static_cast<size_t>(asize);
    return ret;
}